

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O0

void * sigczero_rev_new(t_float re,t_float im)

{
  t_object *owner;
  _inlet *p_Var1;
  t_sigczero_rev *x;
  t_float im_local;
  t_float re_local;
  
  owner = (t_object *)pd_new(sigczero_rev_class);
  inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  p_Var1 = inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  pd_float(&p_Var1->i_pd,re);
  p_Var1 = inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  pd_float(&p_Var1->i_pd,im);
  outlet_new(owner,&s_signal);
  outlet_new(owner,&s_signal);
  *(undefined4 *)&owner[1].te_g.g_next = 0;
  *(undefined4 *)((long)&owner[1].te_g.g_pd + 4) = 0;
  *(undefined4 *)&owner[1].te_g.g_pd = 0;
  return owner;
}

Assistant:

static void *sigczero_rev_new(t_float re, t_float im)
{
    t_sigczero_rev *x = (t_sigczero_rev *)pd_new(sigczero_rev_class);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    pd_float(
        (t_pd *)inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal),
            re);
    pd_float(
        (t_pd *)inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal),
            im);
    outlet_new(&x->x_obj, &s_signal);
    outlet_new(&x->x_obj, &s_signal);
    x->x_lastre = x->x_lastim = 0;
    x->x_f = 0;
    return (x);
}